

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * pstore::path::posix::join
                   (string *__return_storage_ptr__,string *a,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *p)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  iterator pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (a->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + a->_M_string_length);
  if (p->_M_len != 0) {
    pbVar3 = p->_M_array;
    lVar2 = p->_M_len << 5;
    do {
      if ((pbVar3->_M_string_length == 0) || (*(pbVar3->_M_dataplus)._M_p != '/')) {
        if ((__return_storage_ptr__->_M_string_length != 0) &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            != '/')) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pbVar3->_M_dataplus)._M_p);
      }
      else {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      pbVar3 = pbVar3 + 1;
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join (std::string const & a, std::initializer_list<std::string> const & p) {
                std::string path = a;
                for (auto const & b : p) {
                    if (starts_with (b, '/')) {
                        path = b;
                    } else if (path.empty () || ends_with (path, '/')) {
                        path += b;
                    } else {
                        path += '/';
                        path += b;
                    }
                }
                return path;
            }